

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::verify
          (ImageCopyFromImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int y;
  size_t size;
  deInt32 x;
  int x_00;
  Random rng;
  UVec4 local_78;
  deRandom local_68;
  PixelBufferAccess local_58;
  
  deRandom_init(&local_68,this->m_seed);
  ReferenceMemory::setUndefined((ReferenceMemory *)(ctx + 0x18),this->m_imageMemorySize,size);
  tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 0x48));
  for (y = 0; y < this->m_imageHeight; y = y + 1) {
    for (x_00 = 0; x_00 < this->m_imageWidth; x_00 = x_00 + 1) {
      dVar1 = deRandom_getUint32(&local_68);
      dVar2 = deRandom_getUint32(&local_68);
      dVar3 = deRandom_getUint32(&local_68);
      dVar4 = deRandom_getUint32(&local_68);
      local_78.m_data[0] = dVar1 & 0xff;
      local_78.m_data[1] = dVar2 & 0xff;
      local_78.m_data[2] = dVar3 & 0xff;
      local_78.m_data[3] = dVar4 & 0xff;
      tcu::PixelBufferAccess::setPixel(&local_58,&local_78,x_00,y,0);
    }
  }
  return (int)this;
}

Assistant:

void ImageCopyFromImage::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	reference.setUndefined(0, (size_t)m_imageMemorySize);

	{
		const PixelBufferAccess&	refAccess	(context.getReferenceImage().getAccess());

		for (deInt32 y = 0; y < m_imageHeight; y++)
		for (deInt32 x = 0; x < m_imageWidth; x++)
		{
			const deUint8 r8 = rng.getUint8();
			const deUint8 g8 = rng.getUint8();
			const deUint8 b8 = rng.getUint8();
			const deUint8 a8 = rng.getUint8();

			refAccess.setPixel(UVec4(r8, g8, b8, a8), x, y);
		}
	}
}